

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlTextReaderPtr xmlReaderForMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  xmlTextReaderPtr reader;
  
  input = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
  if (input != (xmlParserInputBufferPtr)0x0) {
    reader = xmlNewTextReader(input,URL);
    if (reader == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
    }
    else {
      *(byte *)&reader->allocs = (byte)reader->allocs | 1;
      iVar1 = xmlTextReaderSetup(reader,(xmlParserInputBufferPtr)0x0,URL,encoding,options);
      if (-1 < iVar1) {
        return reader;
      }
      xmlFreeTextReader(reader);
    }
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlReaderForMemory(const char *buffer, int size, const char *URL,
                   const char *encoding, int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr buf;

    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        return (NULL);
    }
    reader = xmlNewTextReader(buf, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(buf);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    if (xmlTextReaderSetup(reader, NULL, URL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}